

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O3

void __thiscall TextReader::parse_hex(TextReader *this)

{
  long lVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  pointer pcVar5;
  size_t sVar6;
  _Alloc_hider _Var7;
  size_t sVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  string local_58;
  string local_38;
  
  sVar3 = this->current_token_pos_;
  sVar6 = this->current_token_len_;
  sVar8 = sVar6 + 2;
  uVar4 = (this->current_line_)._M_string_length;
  this->current_token_len_ = sVar8;
  if (sVar6 + sVar3 + 2 < uVar4) {
    pcVar5 = (this->current_line_)._M_dataplus._M_p;
    sVar6 = sVar8;
    do {
      bVar2 = pcVar5[sVar6 + sVar3];
      sVar8 = sVar6;
      if ((char)bVar2 < '0') break;
      if (0x39 < bVar2) {
        if (bVar2 < 0x41) break;
        if (5 < (byte)(bVar2 + 0x9f) && 0x46 < bVar2) {
          if (0x5a < bVar2) {
            if (bVar2 < 0x61) {
              if (bVar2 != 0x5f) break;
            }
            else if (0x7a < bVar2) break;
          }
          paVar9 = &local_38.field_2;
          local_38._M_dataplus._M_p = (pointer)paVar9;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_38,"Invalid symbol in hexadecimal value","");
          parse_error(this,&local_38);
          _Var7._M_p = local_38._M_dataplus._M_p;
          goto LAB_0010b705;
        }
      }
      sVar8 = sVar6 + 1;
      this->current_token_len_ = sVar8;
      lVar1 = sVar3 + sVar6;
      sVar6 = sVar8;
    } while (lVar1 + 1U < uVar4);
  }
  if (sVar8 == 2) {
    paVar9 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Hexadecimal value prefix specified without the value","");
    parse_error(this,&local_58);
    _Var7._M_p = local_58._M_dataplus._M_p;
LAB_0010b705:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p != paVar9) {
      operator_delete(_Var7._M_p);
    }
  }
  return;
}

Assistant:

inline void parse_hex() {
        current_token_len_++;
        current_token_len_++;
        while (current_token_pos_ + current_token_len_ < current_line_.size() &&
               _is_hex_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            current_token_len_++;
        };
        if (current_token_pos_ + current_token_len_ < current_line_.size() &&
            _is_literal_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            parse_error(ERROR_HEX_INVALID_SYMBOL);
        } else if (current_token_len_ == 2) {
            parse_error(ERROR_MISSING_HEX_VALUE);
        };
    }